

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.cpp
# Opt level: O3

void duckdb_brotli::BrotliWriteHuffmanTree
               (uint8_t *depth,size_t length,size_t *tree_size,uint8_t *tree,
               uint8_t *extra_bits_data)

{
  uint8_t uVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  size_t sVar11;
  size_t sVar12;
  ulong uVar13;
  bool bVar14;
  
  uVar3 = length;
  if (length == 0) {
    return;
  }
LAB_01c158aa:
  if (depth[uVar3 - 1] == '\0') goto code_r0x01c158b1;
  if (length < 0x33) {
    bVar14 = false;
    bVar2 = false;
    goto LAB_01c159af;
  }
  if (uVar3 != 0) {
    lVar7 = 1;
    uVar4 = 0;
    lVar9 = 1;
    uVar5 = 0;
    uVar8 = 0;
    do {
      uVar10 = uVar8 + 1;
      uVar13 = 1;
      if (uVar10 < uVar3) {
        uVar10 = uVar13;
        do {
          uVar13 = uVar10;
          if (depth[uVar10 + uVar8] != depth[uVar8]) break;
          uVar10 = uVar10 + 1;
          uVar13 = uVar3 - uVar8;
        } while (uVar3 - uVar8 != uVar10);
        uVar10 = uVar8 + uVar13;
      }
      bVar14 = depth[uVar8] == '\0';
      lVar9 = lVar9 + (ulong)(bVar14 && 2 < uVar13);
      uVar8 = 0;
      if (bVar14 && 2 < uVar13) {
        uVar8 = uVar13;
      }
      uVar4 = uVar4 + uVar8;
      uVar8 = uVar13;
      if (3 >= uVar13 || bVar14) {
        uVar8 = 0;
      }
      uVar5 = uVar5 + uVar8;
      lVar7 = lVar7 + (ulong)(3 < uVar13 && !bVar14);
      uVar8 = uVar10;
    } while (uVar10 < uVar3);
    uVar8 = lVar7 * 2;
    uVar10 = lVar9 * 2;
    goto LAB_01c15990;
  }
  goto LAB_01c1597d;
code_r0x01c158b1:
  uVar3 = uVar3 - 1;
  if (uVar3 == 0) goto code_r0x01c158b6;
  goto LAB_01c158aa;
code_r0x01c158b6:
  if (0x32 < length) {
LAB_01c1597d:
    uVar10 = 2;
    uVar3 = 0;
    uVar5 = 0;
    uVar8 = 2;
    uVar4 = 0;
LAB_01c15990:
    bVar14 = uVar8 < uVar5;
    bVar2 = uVar10 < uVar4;
LAB_01c159af:
    if (uVar3 != 0) {
      uVar6 = '\b';
      uVar8 = 0;
      do {
        uVar1 = depth[uVar8];
        if ((((bool)(uVar1 != '\0' & bVar14)) || ((bool)(uVar1 == '\0' & bVar2))) &&
           (uVar8 + 1 < uVar3)) {
          uVar4 = 1;
          do {
            uVar5 = uVar4;
            if (depth[uVar4 + uVar8] != uVar1) break;
            uVar4 = uVar4 + 1;
            uVar5 = uVar3 - uVar8;
          } while (uVar3 - uVar8 != uVar4);
          if (uVar1 == '\0') {
            if (uVar5 == 0xb) {
              tree[*tree_size] = '\0';
              extra_bits_data[*tree_size] = '\0';
              sVar12 = *tree_size + 1;
              *tree_size = sVar12;
              uVar4 = 7;
              uVar5 = 0xb;
            }
            else {
              if (uVar5 < 3) {
                if (uVar5 != 0) goto LAB_01c15b7e;
                uVar5 = 0;
                goto LAB_01c15b9d;
              }
              sVar12 = *tree_size;
              uVar4 = uVar5 - 3;
            }
            tree[sVar12] = '\x11';
            extra_bits_data[*tree_size] = (byte)uVar4 & 7;
            uVar10 = *tree_size;
            sVar11 = uVar10 + 1;
            *tree_size = sVar11;
            while (7 < uVar4) {
              uVar4 = (uVar4 >> 3) - 1;
              tree[sVar11] = '\x11';
              extra_bits_data[*tree_size] = (byte)uVar4 & 7;
              uVar10 = *tree_size;
              sVar11 = uVar10 + 1;
              *tree_size = sVar11;
            }
            uVar4 = sVar12;
            if (sVar12 < uVar10) {
              do {
                uVar13 = uVar4 + 1;
                uVar1 = tree[uVar4];
                tree[uVar4] = tree[uVar10];
                tree[uVar10] = uVar1;
                uVar10 = uVar10 - 1;
                uVar4 = uVar13;
              } while (uVar13 < uVar10);
              sVar11 = *tree_size;
            }
            uVar4 = sVar11 - 1;
            if (sVar12 < uVar4) {
              do {
                uVar10 = sVar12 + 1;
                uVar1 = extra_bits_data[sVar12];
                extra_bits_data[sVar12] = extra_bits_data[uVar4];
                extra_bits_data[uVar4] = uVar1;
                uVar4 = uVar4 - 1;
                sVar12 = uVar10;
              } while (uVar10 < uVar4);
            }
          }
          else {
LAB_01c15a47:
            uVar4 = uVar5;
            if (uVar6 != uVar1) {
              tree[*tree_size] = uVar1;
              extra_bits_data[*tree_size] = '\0';
              *tree_size = *tree_size + 1;
              uVar4 = uVar5 - 1;
            }
            uVar6 = uVar1;
            if (uVar4 == 7) {
              tree[*tree_size] = uVar1;
              extra_bits_data[*tree_size] = '\0';
              sVar12 = *tree_size + 1;
              *tree_size = sVar12;
              uVar4 = 3;
            }
            else {
              if (uVar4 < 3) {
                if (uVar4 != 0) {
                  sVar12 = *tree_size;
                  do {
                    tree[sVar12] = uVar1;
                    extra_bits_data[*tree_size] = '\0';
                    sVar12 = *tree_size + 1;
                    *tree_size = sVar12;
                    uVar4 = uVar4 - 1;
                  } while (uVar4 != 0);
                }
                goto LAB_01c15b9d;
              }
              sVar12 = *tree_size;
              uVar4 = uVar4 - 3;
            }
            tree[sVar12] = '\x10';
            extra_bits_data[*tree_size] = (byte)uVar4 & 3;
            uVar10 = *tree_size;
            sVar11 = uVar10 + 1;
            *tree_size = sVar11;
            while (3 < uVar4) {
              uVar4 = (uVar4 >> 2) - 1;
              tree[sVar11] = '\x10';
              extra_bits_data[*tree_size] = (byte)uVar4 & 3;
              uVar10 = *tree_size;
              sVar11 = uVar10 + 1;
              *tree_size = sVar11;
            }
            uVar4 = sVar12;
            if (sVar12 < uVar10) {
              do {
                uVar13 = uVar4 + 1;
                uVar1 = tree[uVar4];
                tree[uVar4] = tree[uVar10];
                tree[uVar10] = uVar1;
                uVar10 = uVar10 - 1;
                uVar4 = uVar13;
              } while (uVar13 < uVar10);
              sVar11 = *tree_size;
            }
            uVar4 = sVar11 - 1;
            if (sVar12 < uVar4) {
              do {
                uVar10 = sVar12 + 1;
                uVar1 = extra_bits_data[sVar12];
                extra_bits_data[sVar12] = extra_bits_data[uVar4];
                extra_bits_data[uVar4] = uVar1;
                uVar4 = uVar4 - 1;
                sVar12 = uVar10;
              } while (uVar10 < uVar4);
            }
          }
        }
        else {
          uVar5 = 1;
          if (uVar1 != '\0') goto LAB_01c15a47;
LAB_01c15b7e:
          sVar12 = *tree_size;
          uVar4 = uVar5;
          do {
            tree[sVar12] = '\0';
            extra_bits_data[*tree_size] = '\0';
            sVar12 = *tree_size + 1;
            *tree_size = sVar12;
            uVar4 = uVar4 - 1;
          } while (uVar4 != 0);
        }
LAB_01c15b9d:
        uVar8 = uVar8 + uVar5;
      } while (uVar8 < uVar3);
    }
  }
  return;
}

Assistant:

void duckdb_brotli::BrotliWriteHuffmanTree(const uint8_t* depth,
                            size_t length,
                            size_t* tree_size,
                            uint8_t* tree,
                            uint8_t* extra_bits_data) {
  uint8_t previous_value = BROTLI_INITIAL_REPEATED_CODE_LENGTH;
  size_t i;
  BROTLI_BOOL use_rle_for_non_zero = BROTLI_FALSE;
  BROTLI_BOOL use_rle_for_zero = BROTLI_FALSE;

  /* Throw away trailing zeros. */
  size_t new_length = length;
  for (i = 0; i < length; ++i) {
    if (depth[length - i - 1] == 0) {
      --new_length;
    } else {
      break;
    }
  }

  /* First gather statistics on if it is a good idea to do RLE. */
  if (length > 50) {
    /* Find RLE coding for longer codes.
       Shorter codes seem not to benefit from RLE. */
    DecideOverRleUse(depth, new_length,
                     &use_rle_for_non_zero, &use_rle_for_zero);
  }

  /* Actual RLE coding. */
  for (i = 0; i < new_length;) {
    const uint8_t value = depth[i];
    size_t reps = 1;
    if ((value != 0 && use_rle_for_non_zero) ||
        (value == 0 && use_rle_for_zero)) {
      size_t k;
      for (k = i + 1; k < new_length && depth[k] == value; ++k) {
        ++reps;
      }
    }
    if (value == 0) {
      BrotliWriteHuffmanTreeRepetitionsZeros(
          reps, tree_size, tree, extra_bits_data);
    } else {
      BrotliWriteHuffmanTreeRepetitions(previous_value,
                                        value, reps, tree_size,
                                        tree, extra_bits_data);
      previous_value = value;
    }
    i += reps;
  }
}